

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int checksum_final(archive_read *a,void *a_sum_val,size_t a_sum_len,void *e_sum_val,size_t e_sum_len
                  )

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = a->format->data;
  iVar2 = _checksum_final((chksumwork *)((long)pvVar1 + 0x170),a_sum_val,a_sum_len);
  if ((iVar2 == 0) &&
     (iVar2 = _checksum_final((chksumwork *)((long)pvVar1 + 0x188),e_sum_val,e_sum_len), iVar2 == 0)
     ) {
    return 0;
  }
  archive_set_error(&a->archive,-1,"Sumcheck error");
  return iVar2;
}

Assistant:

static int
_checksum_final(struct chksumwork *sumwrk, const void *val, size_t len)
{
	unsigned char sum[MAX_SUM_SIZE];
	int r = ARCHIVE_OK;

	switch (sumwrk->alg) {
	case CKSUM_NONE:
		break;
	case CKSUM_SHA1:
		archive_sha1_final(&(sumwrk->sha1ctx), sum);
		if (len != SHA1_SIZE ||
		    memcmp(val, sum, SHA1_SIZE) != 0)
			r = ARCHIVE_FAILED;
		break;
	case CKSUM_MD5:
		archive_md5_final(&(sumwrk->md5ctx), sum);
		if (len != MD5_SIZE ||
		    memcmp(val, sum, MD5_SIZE) != 0)
			r = ARCHIVE_FAILED;
		break;
	}
	return (r);
}